

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2edge_crosser.h
# Opt level: O0

int __thiscall S2EdgeCrosser::CrossingSign(S2EdgeCrosser *this,S2Point *d)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  int bda;
  S2LogMessage local_38;
  S2LogMessageVoidify local_21;
  S2Point *local_20;
  S2Point *d_local;
  S2EdgeCrosser *this_local;
  
  local_20 = d;
  d_local = (S2Point *)this;
  bVar1 = S2::IsUnitLength(d);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    iVar2 = s2pred::TriageSign(this->a_,this->b_,local_20,&this->a_cross_b_);
    if ((this->acb_ == -iVar2) && (iVar2 != 0)) {
      this->c_ = local_20;
      this->acb_ = -iVar2;
      this_local._4_4_ = -1;
    }
    else {
      this->bda_ = iVar2;
      this_local._4_4_ = CrossingSignInternal(this,local_20);
    }
    return this_local._4_4_;
  }
  S2FatalLogMessage::S2FatalLogMessage
            ((S2FatalLogMessage *)&local_38,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2edge_crosser.h"
             ,0x108,kFatal,(ostream *)&std::cerr);
  poVar3 = S2LogMessage::stream(&local_38);
  poVar3 = std::operator<<(poVar3,"Check failed: S2::IsUnitLength(*d) ");
  S2LogMessageVoidify::operator&(&local_21,poVar3);
  S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_38);
}

Assistant:

inline int S2EdgeCrosser::CrossingSign(const S2Point* d) {
  S2_DCHECK(S2::IsUnitLength(*d));
  // For there to be an edge crossing, the triangles ACB, CBD, BDA, DAC must
  // all be oriented the same way (CW or CCW).  We keep the orientation of ACB
  // as part of our state.  When each new point D arrives, we compute the
  // orientation of BDA and check whether it matches ACB.  This checks whether
  // the points C and D are on opposite sides of the great circle through AB.

  // Recall that TriageSign is invariant with respect to rotating its
  // arguments, i.e. ABD has the same orientation as BDA.
  int bda = s2pred::TriageSign(*a_, *b_, *d, a_cross_b_);
  if (acb_ == -bda && bda != 0) {
    // The most common case -- triangles have opposite orientations.  Save the
    // current vertex D as the next vertex C, and also save the orientation of
    // the new triangle ACB (which is opposite to the current triangle BDA).
    c_ = d;
    acb_ = -bda;
    return -1;
  }
  bda_ = bda;
  return CrossingSignInternal(d);
}